

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
::Print(TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
        *this,char *name,ostream *out,MatrixOutputFormat form)

{
  ostream *poVar1;
  void *pvVar2;
  int64_t iVar3;
  int *piVar4;
  undefined4 in_ECX;
  ostream *in_RDX;
  ostream *in_RDI;
  ostream *in_stack_00000010;
  char *in_stack_00000018;
  int64_t i;
  char *in_stack_ffffffffffffffd8;
  long lVar5;
  long index;
  undefined4 in_stack_ffffffffffffffe0;
  
  poVar1 = std::operator<<(in_RDX,"Frontal Matrix associated");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TPZFrontNonSym<std::complex<double>_>::Print
            ((TPZFrontNonSym<std::complex<double>_> *)i,in_stack_00000018,in_stack_00000010);
  poVar1 = std::operator<<(in_RDX,"Stored Equations");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TPZStackEqnStorage<std::complex<double>_>::Print
            ((TPZStackEqnStorage<std::complex<double>_> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffd8,in_RDI);
  poVar1 = std::operator<<(in_RDX,"Number of Equations ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(long *)(in_RDI + 0x33390));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Number of Elements connected to DF");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  lVar5 = 0;
  while( true ) {
    index = lVar5;
    iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x333a0));
    if (iVar3 <= lVar5) break;
    poVar1 = (ostream *)std::ostream::operator<<(in_RDX,index);
    poVar1 = std::operator<<(poVar1," ");
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x333a0),index);
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*piVar4);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    lVar5 = index + 1;
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const
{
	int64_t i;
	out << "Frontal Matrix associated"<< endl;
	fFront.Print(name, out);
	out << "Stored Equations" << endl;
	fStorage.Print(name, out);
	out << "Number of Equations " << fNumEq << endl;
	out << "Number of Elements connected to DF" << endl;
	for(i=0;i<fNumElConnected.NElements();i++){
		out << i << " " << fNumElConnected[i] << endl;
	}
}